

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void handleEvents(double *timeout)

{
  _GLFWwindow *window_00;
  int iVar1;
  GLFWbool GVar2;
  ssize_t sVar3;
  undefined1 local_58 [8];
  uint64_t repeats_1;
  uint64_t i;
  uint64_t repeats;
  _GLFWwindow *window;
  pollfd fds [4];
  GLFWbool event;
  double *timeout_local;
  
  if (_glfw.joysticksInitialized != 0) {
    _glfwDetectJoystickConnectionLinux();
  }
  fds[3].events = 0;
  fds[3].revents = 0;
  window._0_4_ = (*_glfw.wl.client.display_get_fd)(_glfw.wl.display);
  window._4_2_ = 1;
  window._6_2_ = 0;
  fds[0].fd = _glfw.wl.keyRepeatTimerfd;
  fds[0].events = 1;
  fds[0].revents = 0;
  fds[1].fd = _glfw.wl.cursorTimerfd;
  fds[1].events = 1;
  fds[1].revents = 0;
  fds[2].fd = -1;
  fds[2].events = 1;
  fds[2].revents = 0;
  if (_glfw.wl.libdecor.context != (libdecor *)0x0) {
    fds[2].fd = (*_glfw.wl.libdecor.libdecor_get_fd_)(_glfw.wl.libdecor.context);
  }
LAB_00135a04:
  if (fds[3]._4_4_ == 0) {
    while (iVar1 = (*_glfw.wl.client.display_prepare_read)(_glfw.wl.display), iVar1 != 0) {
      iVar1 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
      if (0 < iVar1) {
        return;
      }
    }
    GVar2 = flushDisplay();
    if (GVar2 != 0) {
      GVar2 = _glfwPollPOSIX((pollfd *)&window,4,timeout);
      if (GVar2 == 0) {
        (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
        return;
      }
      if ((window._6_2_ & 1) == 0) {
        (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
      }
      else {
        (*_glfw.wl.client.display_read_events)(_glfw.wl.display);
        iVar1 = (*_glfw.wl.client.display_dispatch_pending)(_glfw.wl.display);
        if (0 < iVar1) {
          fds[3].events = 1;
          fds[3].revents = 0;
        }
      }
      if (((fds[0].revents & 1U) != 0) && (sVar3 = read(_glfw.wl.keyRepeatTimerfd,&i,8), sVar3 == 8)
         ) {
        for (repeats_1 = 0; window_00 = _glfw.wl.keyboardFocus, repeats_1 < i;
            repeats_1 = repeats_1 + 1) {
          iVar1 = translateKey(_glfw.wl.keyRepeatScancode);
          _glfwInputKey(window_00,iVar1,_glfw.wl.keyRepeatScancode,1,_glfw.wl.xkb.modifiers);
          inputText(_glfw.wl.keyboardFocus,_glfw.wl.keyRepeatScancode);
        }
        fds[3].events = 1;
        fds[3].revents = 0;
      }
      if (((fds[1].revents & 1U) != 0) &&
         (sVar3 = read(_glfw.wl.cursorTimerfd,local_58,8), sVar3 == 8)) {
        incrementCursorImage(_glfw.wl.pointerFocus);
      }
      if (((fds[2].revents & 1U) != 0) &&
         (iVar1 = (*_glfw.wl.libdecor.libdecor_dispatch_)(_glfw.wl.libdecor.context,0), 0 < iVar1))
      {
        fds[3].events = 1;
        fds[3].revents = 0;
      }
      goto LAB_00135a04;
    }
    (*_glfw.wl.client.display_cancel_read)(_glfw.wl.display);
    for (repeats = (uint64_t)_glfw.windowListHead; repeats != 0; repeats = *(uint64_t *)repeats) {
      _glfwInputWindowCloseRequest((_GLFWwindow *)repeats);
    }
  }
  return;
}

Assistant:

static void handleEvents(double* timeout)
{
#if defined(GLFW_BUILD_LINUX_JOYSTICK)
    if (_glfw.joysticksInitialized)
        _glfwDetectJoystickConnectionLinux();
#endif

    GLFWbool event = GLFW_FALSE;
    enum { DISPLAY_FD, KEYREPEAT_FD, CURSOR_FD, LIBDECOR_FD };
    struct pollfd fds[] =
    {
        [DISPLAY_FD] = { wl_display_get_fd(_glfw.wl.display), POLLIN },
        [KEYREPEAT_FD] = { _glfw.wl.keyRepeatTimerfd, POLLIN },
        [CURSOR_FD] = { _glfw.wl.cursorTimerfd, POLLIN },
        [LIBDECOR_FD] = { -1, POLLIN }
    };

    if (_glfw.wl.libdecor.context)
        fds[LIBDECOR_FD].fd = libdecor_get_fd(_glfw.wl.libdecor.context);

    while (!event)
    {
        while (wl_display_prepare_read(_glfw.wl.display) != 0)
        {
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                return;
        }

        // If an error other than EAGAIN happens, we have likely been disconnected
        // from the Wayland session; try to handle that the best we can.
        if (!flushDisplay())
        {
            wl_display_cancel_read(_glfw.wl.display);

            _GLFWwindow* window = _glfw.windowListHead;
            while (window)
            {
                _glfwInputWindowCloseRequest(window);
                window = window->next;
            }

            return;
        }

        if (!_glfwPollPOSIX(fds, sizeof(fds) / sizeof(fds[0]), timeout))
        {
            wl_display_cancel_read(_glfw.wl.display);
            return;
        }

        if (fds[DISPLAY_FD].revents & POLLIN)
        {
            wl_display_read_events(_glfw.wl.display);
            if (wl_display_dispatch_pending(_glfw.wl.display) > 0)
                event = GLFW_TRUE;
        }
        else
            wl_display_cancel_read(_glfw.wl.display);

        if (fds[KEYREPEAT_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.keyRepeatTimerfd, &repeats, sizeof(repeats)) == 8)
            {
                for (uint64_t i = 0; i < repeats; i++)
                {
                    _glfwInputKey(_glfw.wl.keyboardFocus,
                                  translateKey(_glfw.wl.keyRepeatScancode),
                                  _glfw.wl.keyRepeatScancode,
                                  GLFW_PRESS,
                                  _glfw.wl.xkb.modifiers);
                    inputText(_glfw.wl.keyboardFocus, _glfw.wl.keyRepeatScancode);
                }

                event = GLFW_TRUE;
            }
        }

        if (fds[CURSOR_FD].revents & POLLIN)
        {
            uint64_t repeats;

            if (read(_glfw.wl.cursorTimerfd, &repeats, sizeof(repeats)) == 8)
                incrementCursorImage(_glfw.wl.pointerFocus);
        }

        if (fds[LIBDECOR_FD].revents & POLLIN)
        {
            if (libdecor_dispatch(_glfw.wl.libdecor.context, 0) > 0)
                event = GLFW_TRUE;
        }
    }
}